

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O1

bool Diligent::VerifyCopyTLASAttribs(CopyTLASAttribs *Attribs)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char (*in_RCX) [69];
  bool bVar5;
  string msg;
  string local_38;
  
  if (Attribs->pSrc == (ITopLevelAS *)0x0) {
    FormatString<char[32],char[23]>
              (&local_38,(Diligent *)"Copy TLAS attribs are invalid: ",
               (char (*) [32])"pSrc must not be null.",(char (*) [23])in_RCX);
    in_RCX = (char (*) [69])0x3ee;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"VerifyCopyTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x3ee);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if (Attribs->pDst == (ITopLevelAS *)0x0) {
    FormatString<char[32],char[23]>
              (&local_38,(Diligent *)"Copy TLAS attribs are invalid: ",
               (char (*) [32])"pDst must not be null.",(char (*) [23])in_RCX);
    in_RCX = (char (*) [69])0x3ef;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"VerifyCopyTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x3ef);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if (Attribs->Mode == COPY_AS_MODE_COMPACT) {
    iVar3 = (*(Attribs->pSrc->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    iVar4 = (*(Attribs->pDst->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    if ((*(byte *)(CONCAT44(extraout_var_01,iVar3) + 0xc) & 2) == 0) {
      FormatString<char[32],char[69]>
                (&local_38,(Diligent *)"Copy TLAS attribs are invalid: ",
                 (char (*) [32])
                 "pSrc was not created with RAYTRACING_BUILD_AS_ALLOW_COMPACTION flag.",in_RCX);
      in_RCX = (char (*) [69])0x3fe;
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"VerifyCopyTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x3fe);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    bVar5 = true;
    if (*(long *)(CONCAT44(extraout_var_02,iVar4) + 0x10) == 0) {
      FormatString<char[32],char[56]>
                (&local_38,(Diligent *)"Copy TLAS attribs are invalid: ",
                 (char (*) [32])"pDst must have been create with non-zero CompactedSize.",
                 (char (*) [56])in_RCX);
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"VerifyCopyTLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x3ff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else if (Attribs->Mode == COPY_AS_MODE_CLONE) {
    iVar3 = (*(Attribs->pSrc->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    iVar4 = (*(Attribs->pDst->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    uVar2 = *(uint *)(CONCAT44(extraout_var,iVar3) + 8);
    if ((uVar2 == *(uint *)(CONCAT44(extraout_var_00,iVar4) + 8)) &&
       (cVar1 = *(char *)(CONCAT44(extraout_var,iVar3) + 0xc),
       uVar2 = CONCAT31((int3)(uVar2 >> 8),cVar1),
       cVar1 == *(char *)(CONCAT44(extraout_var_00,iVar4) + 0xc))) {
      return true;
    }
    FormatString<char[32],char[62]>
              (&local_38,(Diligent *)"Copy TLAS attribs are invalid: ",
               (char (*) [32])"pDst must have been created with the same parameters as pSrc.",
               (char (*) [62])(ulong)uVar2);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"VerifyCopyTLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x3f7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    bVar5 = true;
  }
  else {
    FormatString<char[40]>(&local_38,(char (*) [40])"IDeviceContext::CopyTLAS: unknown Mode.");
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,local_38._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool VerifyCopyTLASAttribs(const CopyTLASAttribs& Attribs)
{
#define CHECK_COPY_TLAS_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Copy TLAS attribs are invalid: ", __VA_ARGS__)

    CHECK_COPY_TLAS_ATTRIBS(Attribs.pSrc != nullptr, "pSrc must not be null.");
    CHECK_COPY_TLAS_ATTRIBS(Attribs.pDst != nullptr, "pDst must not be null.");

    if (Attribs.Mode == COPY_AS_MODE_CLONE)
    {
        const TopLevelASDesc& SrcDesc = Attribs.pSrc->GetDesc();
        const TopLevelASDesc& DstDesc = Attribs.pDst->GetDesc();

        CHECK_COPY_TLAS_ATTRIBS(SrcDesc.MaxInstanceCount == DstDesc.MaxInstanceCount && SrcDesc.Flags == DstDesc.Flags,
                                "pDst must have been created with the same parameters as pSrc.");
    }
    else if (Attribs.Mode == COPY_AS_MODE_COMPACT)
    {
        const TopLevelASDesc& SrcDesc = Attribs.pSrc->GetDesc();
        const TopLevelASDesc& DstDesc = Attribs.pDst->GetDesc();

        CHECK_COPY_TLAS_ATTRIBS((SrcDesc.Flags & RAYTRACING_BUILD_AS_ALLOW_COMPACTION) == RAYTRACING_BUILD_AS_ALLOW_COMPACTION, "pSrc was not created with RAYTRACING_BUILD_AS_ALLOW_COMPACTION flag.");
        CHECK_COPY_TLAS_ATTRIBS(DstDesc.CompactedSize != 0, "pDst must have been create with non-zero CompactedSize.");
    }
    else
    {
        LOG_ERROR_MESSAGE("IDeviceContext::CopyTLAS: unknown Mode.");
        return false;
    }
#undef CHECK_COPY_TLAS_ATTRIBS

    return true;
}